

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

string * __thiscall
duckdb_re2::DFA::DumpWorkq_abi_cxx11_(string *__return_storage_ptr__,DFA *this,Workq *q)

{
  int *piVar1;
  char *pcVar2;
  int *piVar3;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = anon_var_dwarf_3b2a81b + 9;
  piVar1 = *(int **)((long)&(this->mutex_).mutex_ + 0x10);
  for (piVar3 = piVar1; piVar3 != piVar1 + *(int *)&this->prog_; piVar3 = piVar3 + 1) {
    if (*piVar3 < (this->mutex_).mutex_.__data.__cur_writer) {
      StringPrintf_abi_cxx11_(&local_50,"%s%d",pcVar2);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      pcVar2 = ",";
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar2 = anon_var_dwarf_3b2a81b + 9;
    }
    piVar1 = *(int **)((long)&(this->mutex_).mutex_ + 0x10);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DFA::DumpWorkq(Workq* q) {
  std::string s;
  const char* sep = "";
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    if (q->is_mark(*it)) {
      s += "|";
      sep = "";
    } else {
      s += StringPrintf("%s%d", sep, *it);
      sep = ",";
    }
  }
  return s;
}